

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ConsumeNumber(Parser *this,double *output,ErrorMaker error)

{
  TokenType TVar1;
  Tokenizer *pTVar2;
  bool bVar3;
  uint64_t in_RAX;
  double dVar4;
  string_view text;
  string_view text_00;
  uint64_t value;
  
  pTVar2 = this->input_;
  TVar1 = (pTVar2->current_).type;
  if (TVar1 == TYPE_INTEGER) {
    value = 0;
    bVar3 = io::Tokenizer::ParseInteger(&(pTVar2->current_).text,0xffffffffffffffff,&value);
    if (bVar3) {
      *output = ((double)CONCAT44(0x45300000,(int)(value >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)value) - 4503599627370496.0);
    }
    else if ((*(this->input_->current_).text._M_dataplus._M_p == '0') ||
            (bVar3 = io::Tokenizer::TryParseFloat(&(this->input_->current_).text,output), !bVar3)) {
      RecordError(this,(ErrorMaker)ZEXT816(0x105b9ea));
    }
  }
  else {
    value = in_RAX;
    if (TVar1 == TYPE_FLOAT) {
      dVar4 = io::Tokenizer::ParseFloat(&(pTVar2->current_).text);
      *output = dVar4;
    }
    else {
      text._M_str = "inf";
      text._M_len = 3;
      bVar3 = LookingAt(this,text);
      if (bVar3) {
        dVar4 = INFINITY;
      }
      else {
        text_00._M_str = "nan";
        text_00._M_len = 3;
        bVar3 = LookingAt(this,text_00);
        if (!bVar3) {
          RecordError(this,error);
          return false;
        }
        dVar4 = NAN;
      }
      *output = dVar4;
    }
  }
  io::Tokenizer::Next(this->input_);
  return true;
}

Assistant:

bool Parser::ConsumeNumber(double* output, ErrorMaker error) {
  if (LookingAtType(io::Tokenizer::TYPE_FLOAT)) {
    *output = io::Tokenizer::ParseFloat(input_->current().text);
    input_->Next();
    return true;
  } else if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
    // Also accept integers.
    uint64_t value = 0;
    if (io::Tokenizer::ParseInteger(input_->current().text,
                                    std::numeric_limits<uint64_t>::max(),
                                    &value)) {
      *output = value;
    } else if (input_->current().text[0] == '0') {
      // octal or hexadecimal; don't bother parsing as float
      RecordError("Integer out of range.");
      // We still return true because we did, in fact, parse a number.
    } else if (!io::Tokenizer::TryParseFloat(input_->current().text, output)) {
      // out of int range, and not valid float? 🤷
      RecordError("Integer out of range.");
      // We still return true because we did, in fact, parse a number.
    }
    input_->Next();
    return true;
  } else if (LookingAt("inf")) {
    *output = std::numeric_limits<double>::infinity();
    input_->Next();
    return true;
  } else if (LookingAt("nan")) {
    *output = std::numeric_limits<double>::quiet_NaN();
    input_->Next();
    return true;
  } else {
    RecordError(error);
    return false;
  }
}